

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O3

ON_UuidIndex * __thiscall ON_UuidIndexList::SearchHelper(ON_UuidIndexList *this,ON_UUID *uuid)

{
  int iVar1;
  uint uVar2;
  ON_UuidIndex *pOVar3;
  int iVar4;
  undefined1 auVar5 [16];
  
  uVar2 = this->m_sorted_count;
  if ((8 < (this->super_ON_SimpleArray<ON_UuidIndex>).m_count - uVar2) ||
     (this->m_removed_count != 0)) {
    ImproveSearchSpeed(this);
    uVar2 = this->m_sorted_count;
  }
  if (uVar2 == 0) {
    uVar2 = 0;
  }
  else {
    pOVar3 = (ON_UuidIndex *)
             bsearch(uuid,(this->super_ON_SimpleArray<ON_UuidIndex>).m_a,(ulong)uVar2,0x14,
                     compar_uuidindex_uuid);
    if (pOVar3 != (ON_UuidIndex *)0x0) {
      return pOVar3;
    }
    uVar2 = this->m_sorted_count;
  }
  iVar1 = (this->super_ON_SimpleArray<ON_UuidIndex>).m_count;
  iVar4 = iVar1 - uVar2;
  if (iVar4 != 0 && (int)uVar2 <= iVar1) {
    pOVar3 = (this->super_ON_SimpleArray<ON_UuidIndex>).m_a + (int)uVar2;
    do {
      auVar5[0] = -((char)(pOVar3->m_id).Data1 == (char)uuid->Data1);
      auVar5[1] = -(*(char *)((long)&(pOVar3->m_id).Data1 + 1) == *(char *)((long)&uuid->Data1 + 1))
      ;
      auVar5[2] = -(*(char *)((long)&(pOVar3->m_id).Data1 + 2) == *(char *)((long)&uuid->Data1 + 2))
      ;
      auVar5[3] = -(*(char *)((long)&(pOVar3->m_id).Data1 + 3) == *(char *)((long)&uuid->Data1 + 3))
      ;
      auVar5[4] = -((char)(pOVar3->m_id).Data2 == (char)uuid->Data2);
      auVar5[5] = -(*(char *)((long)&(pOVar3->m_id).Data2 + 1) == *(char *)((long)&uuid->Data2 + 1))
      ;
      auVar5[6] = -((char)(pOVar3->m_id).Data3 == (char)uuid->Data3);
      auVar5[7] = -(*(char *)((long)&(pOVar3->m_id).Data3 + 1) == *(char *)((long)&uuid->Data3 + 1))
      ;
      auVar5[8] = -((pOVar3->m_id).Data4[0] == uuid->Data4[0]);
      auVar5[9] = -((pOVar3->m_id).Data4[1] == uuid->Data4[1]);
      auVar5[10] = -((pOVar3->m_id).Data4[2] == uuid->Data4[2]);
      auVar5[0xb] = -((pOVar3->m_id).Data4[3] == uuid->Data4[3]);
      auVar5[0xc] = -((pOVar3->m_id).Data4[4] == uuid->Data4[4]);
      auVar5[0xd] = -((pOVar3->m_id).Data4[5] == uuid->Data4[5]);
      auVar5[0xe] = -((pOVar3->m_id).Data4[6] == uuid->Data4[6]);
      auVar5[0xf] = -((pOVar3->m_id).Data4[7] == uuid->Data4[7]);
      if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe | (ushort)(auVar5[0xf] >> 7) << 0xf
                  ) == 0xffff) {
        return pOVar3;
      }
      pOVar3 = pOVar3 + 1;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  return (ON_UuidIndex *)0x0;
}

Assistant:

ON_UuidIndex* ON_UuidIndexList::SearchHelper(const ON_UUID* uuid) const
{
  if ( m_count - m_sorted_count > 8 || m_removed_count > 0 )
  {
    // time to resort the array so that the speedy
    // bsearch() can be used to find uuids
    const_cast<ON_UuidIndexList*>(this)->ImproveSearchSpeed();
  }

  ON_UuidIndex* p = (m_sorted_count > 0 )
                   ? (ON_UuidIndex*)bsearch( uuid, m_a, m_sorted_count, 
                                        sizeof(m_a[0]), 
                                        (int(*)(const void*,const void*))compar_uuidindex_uuid ) 
                   : 0;
  if (0 == p)
  {
    // do a slow search on the last m_count-m_sort_count elements
    // in the array.
    int i;
    for ( i = m_sorted_count; i < m_count; i++ )
    {
      if ( 0 == ON_UuidList::CompareUuid(uuid,&m_a[i].m_id) )
      {
        p = m_a+i;
        break;
      }
    }
  }

  return p;
}